

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QXcbConnection::TabletData::ValuatorClassInfo>_>::Data
          (Data<QHashPrivate::Node<int,_QXcbConnection::TabletData::ValuatorClassInfo>_> *this,
          Data<QHashPrivate::Node<int,_QXcbConnection::TabletData::ValuatorClassInfo>_> *other)

{
  uchar *puVar1;
  Span *pSVar2;
  Entry *pEVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  Node<int,_QXcbConnection::TabletData::ValuatorClassInfo> *pNVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  R RVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar10 = other->numBuckets;
  sVar11 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar11;
  this->spans = (Span *)0x0;
  RVar12 = allocateSpans(sVar10);
  this->spans = (Span *)RVar12.spans;
  if (RVar12.nSpans != 0) {
    lVar9 = 0;
    sVar10 = 0;
    do {
      pSVar2 = other->spans;
      sVar11 = 0;
      do {
        uVar7 = (ulong)pSVar2->offsets[sVar11 + lVar9];
        if (uVar7 != 0xff) {
          pEVar3 = pSVar2[sVar10].entries;
          pNVar8 = Span<QHashPrivate::Node<int,_QXcbConnection::TabletData::ValuatorClassInfo>_>::
                   insert(this->spans + sVar10,sVar11);
          dVar4 = *(double *)(pEVar3[uVar7].storage.data + 8);
          puVar1 = pEVar3[uVar7].storage.data + 0x10;
          dVar5 = *(double *)puVar1;
          dVar6 = *(double *)(puVar1 + 8);
          *(undefined8 *)pNVar8 = *(undefined8 *)pEVar3[uVar7].storage.data;
          (pNVar8->value).minVal = dVar4;
          (pNVar8->value).maxVal = dVar5;
          (pNVar8->value).curVal = dVar6;
          *(undefined8 *)&(pNVar8->value).number =
               *(undefined8 *)(pEVar3[uVar7].storage.data + 0x20);
        }
        sVar11 = sVar11 + 1;
      } while (sVar11 != 0x80);
      sVar10 = sVar10 + 1;
      lVar9 = lVar9 + 0x90;
    } while (sVar10 != RVar12.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }